

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::DataCompare<unsigned_int>
          (DrawIndirectBase *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *dataRef,
          uint widthRef,uint heightRef,vector<unsigned_int,_std::allocator<unsigned_int>_> *dataTest
          ,uint widthTest,uint heightTest,uint offsetYRef,uint offsetYTest)

{
  ostringstream *this_00;
  _func_int **pp_Var1;
  long lVar2;
  runtime_error *this_01;
  undefined4 in_register_0000000c;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 local_338 [384];
  undefined1 local_1b8 [384];
  long local_38;
  
  uVar7 = (uint)dataTest;
  uVar5 = (uint)dataRef;
  pp_Var1 = (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper;
  if ((ulong)((long)(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl -
              (long)pp_Var1 >> 2) < (ulong)(widthRef * uVar5)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Invalid reference buffer resolution!");
  }
  else {
    lVar2 = *(long *)CONCAT44(in_register_0000000c,heightRef);
    if ((ulong)(widthTest * uVar7) <=
        (ulong)(((long *)CONCAT44(in_register_0000000c,heightRef))[1] - lVar2 >> 2)) {
      if (widthTest < widthRef) {
        widthRef = widthTest;
      }
      if (widthRef != 0) {
        uVar8 = (ulong)dataRef & 0xffffffff;
        if (uVar7 < uVar5) {
          uVar8 = (ulong)dataTest & 0xffffffff;
        }
        uVar9 = heightTest * uVar5;
        uVar6 = offsetYRef * uVar7;
        uVar3 = 0;
        do {
          uVar4 = (ulong)uVar9;
          uVar11 = (ulong)uVar6;
          if ((int)uVar8 != 0) {
            lVar10 = 0;
            do {
              if (*(int *)((long)pp_Var1 + uVar4 * 4) != *(int *)(lVar2 + uVar11 * 4)) {
                local_1b8[0] = false;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
                local_38 = -1;
                this_00 = (ostringstream *)(local_338 + 8);
                local_338[0] = (DILogger)0x0;
                std::__cxx11::ostringstream::ostringstream(this_00);
                if (local_338[0] == (DILogger)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"Compare failed: different values [x: ",0x25);
                }
                if (((byte)local_338[0] & 1) == 0) {
                  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                }
                if (((byte)local_338[0] & 1) == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", y: ",5);
                }
                if (((byte)local_338[0] & 1) == 0) {
                  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                }
                if (((byte)local_338[0] & 1) == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,", reference: ",0xd);
                }
                if (((byte)local_338[0] & 1) == 0) {
                  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                }
                glcts::(anonymous_namespace)::DILogger::operator<<
                          ((DILogger *)local_338,(char (*) [9])", test: ");
                if (local_338[0] == (DILogger)0x0) {
                  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                }
                glcts::(anonymous_namespace)::DILogger::operator<<
                          ((DILogger *)local_338,(char (*) [2])0x1a29aea);
                DILogger::~DILogger((DILogger *)local_338);
                lVar2 = local_38;
                DILogger::~DILogger((DILogger *)local_1b8);
                return lVar2;
              }
              lVar10 = lVar10 + -1;
              uVar4 = uVar4 + 1;
              uVar11 = uVar11 + 1;
            } while (-lVar10 != uVar8);
          }
          uVar3 = uVar3 + 1;
          uVar9 = uVar9 + uVar5;
          uVar6 = uVar6 + uVar7;
        } while (uVar3 != widthRef);
      }
      return 0;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Invalid test buffer resolution!");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

long DataCompare(const std::vector<T>& dataRef, unsigned int widthRef, unsigned int heightRef,
					 const std::vector<T>& dataTest, unsigned int widthTest, unsigned int heightTest,
					 unsigned offsetYRef = 0, unsigned offsetYTest = 0)
	{
		if (widthRef * heightRef > dataRef.size())
			throw std::runtime_error("Invalid reference buffer resolution!");

		if (widthTest * heightTest > dataTest.size())
			throw std::runtime_error("Invalid test buffer resolution!");

		unsigned int width  = std::min(widthRef, widthTest);
		unsigned int height = std::min(heightRef, heightTest);

		for (unsigned int i = 0; i < height; ++i)
		{
			unsigned int offsetRef  = (i + offsetYRef) * widthRef;
			unsigned int offsetTest = (i + offsetYTest) * widthTest;

			for (size_t j = 0; j < width; ++j)
			{
				if (dataRef[offsetRef + j] != dataTest[offsetTest + j])
				{
					DIResult status;
					status.error() << "Compare failed: different values [x: " << j << ", y: " << i + offsetYTest
								   << ", reference: " << dataRef[offsetRef + j]
								   << ", test: " << dataTest[offsetTest + j] << "]";
					return status.code();
				}
			}
		}

		return NO_ERROR;
	}